

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::parseRotationParameter(QPDFJob *this,string *parameter)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  element_type *peVar6;
  mapped_type *pmVar7;
  RotationSpec local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  int local_124;
  int angle;
  runtime_error *anon_var_0;
  string local_e0 [39];
  char local_b9;
  string local_b8 [7];
  char first;
  string local_88 [36];
  int local_64;
  long lStack_60;
  int relative;
  size_t colon;
  string range;
  string angle_str;
  string *parameter_local;
  QPDFJob *this_local;
  
  std::__cxx11::string::string((string *)(range.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&colon);
  lStack_60 = std::__cxx11::string::find((char)parameter,0x3a);
  local_64 = 0;
  if (lStack_60 == -1) {
    std::__cxx11::string::operator=((string *)(range.field_2._M_local_buf + 8),(string *)parameter);
  }
  else {
    if (lStack_60 != 0) {
      std::__cxx11::string::substr((ulong)local_88,(ulong)parameter);
      std::__cxx11::string::operator=((string *)(range.field_2._M_local_buf + 8),local_88);
      std::__cxx11::string::~string(local_88);
    }
    uVar2 = lStack_60 + 1;
    uVar3 = std::__cxx11::string::length();
    if (uVar2 < uVar3) {
      std::__cxx11::string::substr((ulong)local_b8,(ulong)parameter);
      std::__cxx11::string::operator=((string *)&colon,local_b8);
      std::__cxx11::string::~string(local_b8);
    }
  }
  lVar4 = std::__cxx11::string::length();
  if (lVar4 != 0) {
    pcVar5 = (char *)std::__cxx11::string::at((ulong)((long)&range.field_2 + 8));
    local_b9 = *pcVar5;
    if ((local_b9 == '+') || (local_b9 == '-')) {
      local_64 = ((local_b9 == '+') - 1) + (uint)(local_b9 == '+');
      std::__cxx11::string::substr((ulong)local_e0,(ulong)((long)&range.field_2 + 8));
      std::__cxx11::string::operator=((string *)(range.field_2._M_local_buf + 8),local_e0);
      std::__cxx11::string::~string(local_e0);
    }
    else {
      pcVar5 = (char *)std::__cxx11::string::at((ulong)((long)&range.field_2 + 8));
      bVar1 = ::qpdf::util::is_digit(*pcVar5);
      if (!bVar1) {
        std::__cxx11::string::operator=((string *)(range.field_2._M_local_buf + 8),"");
      }
    }
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::__cxx11::string::operator=((string *)&colon,"1-z");
  }
  pcVar5 = (char *)std::__cxx11::string::c_str();
  QUtil::parse_numrange((vector<int,_std::allocator<int>_> *)&anon_var_0,pcVar5,0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&anon_var_0);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  local_124 = QUtil::string_to_int(pcVar5);
  local_124 = local_124 % 0x168;
  if (local_124 % 0x5a != 0) {
    std::operator+(&local_148,"invalid parameter to rotate (angle must be a multiple of 90): ",
                   parameter);
    usage(&local_148);
    std::__cxx11::string::~string((string *)&local_148);
  }
  if (local_64 == -1) {
    local_124 = -local_124;
  }
  RotationSpec::RotationSpec(&local_150,local_124,local_64 != 0);
  peVar6 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec>_>_>
           ::operator[](&peVar6->rotations,(key_type *)&colon);
  pmVar7->angle = local_150.angle;
  pmVar7->relative = local_150.relative;
  std::__cxx11::string::~string((string *)&colon);
  std::__cxx11::string::~string((string *)(range.field_2._M_local_buf + 8));
  return;
}

Assistant:

void
QPDFJob::parseRotationParameter(std::string const& parameter)
{
    std::string angle_str;
    std::string range;
    size_t colon = parameter.find(':');
    int relative = 0;
    if (colon != std::string::npos) {
        if (colon > 0) {
            angle_str = parameter.substr(0, colon);
        }
        if (colon + 1 < parameter.length()) {
            range = parameter.substr(colon + 1);
        }
    } else {
        angle_str = parameter;
    }
    if (angle_str.length() > 0) {
        char first = angle_str.at(0);
        if ((first == '+') || (first == '-')) {
            relative = ((first == '+') ? 1 : -1);
            angle_str = angle_str.substr(1);
        } else if (!util::is_digit(angle_str.at(0))) {
            angle_str = "";
        }
    }
    if (range.empty()) {
        range = "1-z";
    }
    try {
        QUtil::parse_numrange(range.c_str(), 0);
    } catch (std::runtime_error const&) {
        usage("invalid parameter to rotate: " + parameter);
    }
    int angle = QUtil::string_to_int(angle_str.c_str()) % 360;
    if (angle % 90 != 0) {
        usage("invalid parameter to rotate (angle must be a multiple of 90): " + parameter);
    }
    if (relative == -1) {
        angle = -angle;
    }
    m->rotations[range] = RotationSpec(angle, (relative != 0));
}